

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture1DArrayView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  bool bVar4;
  int i;
  long lVar5;
  ulong uVar6;
  int y;
  int lodOffsNdx;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Texture1DArrayView TVar15;
  Vector<float,_4> res_2;
  Vector<float,_4> res_4;
  Vec4 refPix;
  Vec4 resPix;
  Vec3 triW [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec2 lodBias;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture1DArrayView src;
  Vec2 lodOffsets [4];
  Vec2 clampedLod;
  int local_1f0;
  undefined4 local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  undefined1 local_1d8 [36];
  float local_1b4;
  ulong local_1b0;
  undefined1 local_1a8 [36];
  float local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  Vec2 local_160;
  float local_158 [4];
  Vec4 local_148;
  float local_138 [8];
  float local_118 [8];
  float local_f8 [6];
  PixelBufferAccess *local_e0;
  undefined1 local_d8 [16];
  Sampler *local_c8;
  ConstPixelBufferAccess *local_c0;
  ConstPixelBufferAccess *local_b8;
  float afStack_b0 [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_a8;
  Texture1DArrayView local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58 [8];
  tcu local_38 [8];
  
  local_a8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = &sampleParams->sampler;
  local_e0 = errorMask;
  local_b8 = reference;
  TVar15 = tcu::getEffectiveTextureView(baseView,&local_a8,local_c8);
  local_88.m_levels = TVar15.m_levels;
  local_88.m_numLevels = TVar15.m_numLevels;
  local_f8[0] = *texCoord;
  local_118[0] = texCoord[1];
  local_f8[1] = texCoord[2];
  local_f8[2] = texCoord[4];
  local_f8[3] = texCoord[6];
  local_118[1] = texCoord[3];
  local_118[2] = texCoord[5];
  local_118[3] = texCoord[7];
  fVar13 = 0.0;
  local_1e4 = 0.0;
  if (0 < local_88.m_numLevels) {
    local_1e4 = (float)((local_88.m_levels)->m_size).m_data[0];
  }
  local_1dc = (float)(result->m_size).m_data[0];
  local_1e0 = (float)(result->m_size).m_data[1];
  local_138[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_138[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_138[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_138[3] = (sampleParams->super_RenderParams).w.m_data[3];
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    fVar13 = (sampleParams->super_RenderParams).bias;
  }
  lVar5 = 0;
  do {
    afStack_b0[lVar5] = fVar13;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  local_58[0] = -1.0;
  local_58[1] = 0.0;
  local_58[2] = 1.0;
  local_58[3] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = -1.0;
  local_58[6] = 0.0;
  local_58[7] = 1.0;
  local_158[0] = -1.7146522e+38;
  local_138[4] = local_138[2];
  local_138[5] = local_138[1];
  local_118[4] = local_118[2];
  local_118[5] = local_118[1];
  local_f8[4] = local_f8[2];
  local_f8[5] = local_f8[1];
  tcu::RGBA::toVec((RGBA *)&local_148);
  tcu::clear(local_e0,&local_148);
  if ((result->m_size).m_data[1] < 1) {
    local_1b0 = 0;
  }
  else {
    local_1b0 = 0;
    local_1f0 = 0;
    local_c0 = result;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (result->m_size).m_data[0]) {
        local_1d8._28_4_ = (float)local_1f0 + 0.5;
        local_1d8._24_4_ = (float)local_1d8._28_4_ / local_1e0;
        local_1a8._32_4_ = local_1e0 - (float)local_1d8._28_4_;
        local_1a8._28_4_ = 1.0 - (float)local_1d8._24_4_;
        y = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1d8,(int)result,y,local_1f0);
          local_158[0] = 0.0;
          local_158[1] = 0.0;
          local_158[2] = 0.0;
          local_158[3] = 0.0;
          lVar5 = 0;
          do {
            local_158[lVar5] =
                 *(float *)(local_1d8 + lVar5 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_148.m_data[0] = 0.0;
          local_148.m_data[1] = 0.0;
          local_148.m_data[2] = 0.0;
          local_148.m_data[3] = 0.0;
          lVar5 = 0;
          do {
            local_148.m_data[lVar5] =
                 local_158[lVar5] / (sampleParams->super_RenderParams).colorScale.m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1a8,(int)local_b8,y,local_1f0);
          local_1d8._0_4_ = R;
          local_1d8._4_4_ = SNORM_INT8;
          local_1d8._8_4_ = 0;
          local_1d8._12_4_ = 0;
          lVar5 = 0;
          do {
            *(float *)(local_1d8 + lVar5 * 4) =
                 *(float *)(local_1a8 + lVar5 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_158[0] = 0.0;
          local_158[1] = 0.0;
          local_158[2] = 0.0;
          local_158[3] = 0.0;
          lVar5 = 0;
          do {
            local_158[lVar5] =
                 *(float *)(local_1d8 + lVar5 * 4) /
                 (sampleParams->super_RenderParams).colorScale.m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_1a8._0_4_ = R;
          local_1a8._4_4_ = SNORM_INT8;
          local_1a8._8_4_ = 0;
          local_1a8._12_4_ = 0;
          lVar5 = 0;
          do {
            *(float *)(local_1a8 + lVar5 * 4) = local_148.m_data[lVar5] - local_158[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_1d8._0_4_ = R;
          local_1d8._4_4_ = SNORM_INT8;
          local_1d8._8_4_ = 0;
          local_1d8._12_4_ = 0;
          lVar5 = 0;
          do {
            fVar13 = *(float *)(local_1a8 + lVar5 * 4);
            fVar8 = -fVar13;
            if (-fVar13 <= fVar13) {
              fVar8 = fVar13;
            }
            *(float *)(local_1d8 + lVar5 * 4) = fVar8;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          local_1ec = 0.0;
          lVar5 = 0;
          do {
            *(bool *)((long)&local_1ec + lVar5) =
                 *(float *)(local_1d8 + lVar5 * 4) <= (lookupPrec->colorThreshold).m_data[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          if (local_1ec._0_1_ == (tcu)0x0) {
LAB_0085230f:
            fVar11 = (float)y + 0.5;
            fVar8 = fVar11 / local_1dc;
            bVar4 = 1.0 <= (float)local_1d8._24_4_ + fVar8;
            fVar13 = (float)local_1d8._24_4_;
            local_1b4 = fVar11;
            local_1d8._32_4_ = local_1d8._28_4_;
            if (bVar4) {
              fVar8 = 1.0 - fVar8;
              fVar13 = (float)local_1a8._28_4_;
              local_1b4 = local_1dc - fVar11;
              local_1d8._32_4_ = local_1a8._32_4_;
            }
            uVar3 = (ulong)bVar4;
            fVar7 = (1.0 - fVar8) - fVar13;
            fVar9 = local_f8[uVar3 * 3];
            fVar10 = local_f8[uVar3 * 3 + 1];
            fVar1 = local_138[uVar3 * 3];
            local_168 = local_138[uVar3 * 3 + 1];
            fVar2 = local_f8[uVar3 * 3 + 2];
            local_16c = local_138[uVar3 * 3 + 2];
            fVar12 = fVar8 / local_16c + fVar13 / local_168 + fVar7 / fVar1;
            local_1a8._4_4_ =
                 ((local_118[uVar3 * 3 + 2] * fVar8) / local_16c +
                 (local_118[uVar3 * 3 + 1] * fVar13) / local_168 +
                 (fVar7 * local_118[uVar3 * 3]) / fVar1) / fVar12;
            local_1a8._0_4_ =
                 ((fVar8 * fVar2) / local_16c +
                 (fVar13 * fVar10) / local_168 + (fVar7 * fVar9) / fVar1) / fVar12;
            local_170 = local_168 * local_16c;
            local_174 = local_16c * local_1dc;
            fVar7 = (local_1dc * (fVar13 + -1.0) + fVar11) * local_170 -
                    (local_174 * fVar13 + fVar11 * local_168) * fVar1;
            fVar14 = fVar1 * local_168 * local_16c;
            fVar12 = fVar14 * local_1dc;
            local_178 = (fVar10 - fVar9) * local_16c + (fVar2 - fVar10) * fVar1;
            local_17c = (fVar9 - fVar2) * local_168;
            local_78 = ZEXT416((uint)fVar12);
            local_180 = local_168 * local_1e0;
            fVar11 = (local_1e0 * (fVar8 + -1.0) + (float)local_1d8._28_4_) * local_170 -
                     (local_180 * fVar8 + (float)local_1d8._28_4_ * local_16c) * fVar1;
            local_d8 = ZEXT416((uint)fVar1);
            local_164 = (fVar10 - fVar2) * fVar1 + (fVar2 - fVar9) * local_168;
            local_184 = (fVar9 - fVar10) * local_16c;
            fVar14 = fVar14 * local_1e0;
            local_68 = ZEXT416((uint)fVar14);
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)&local_1ec,
                       ((((fVar13 + -1.0) * local_17c + fVar13 * local_178) * fVar12) /
                       (fVar7 * fVar7)) * local_1e4,
                       ((((fVar8 + -1.0) * local_184 + fVar8 * local_164) * fVar14) /
                       (fVar11 * fVar11)) * local_1e4,lodPrec);
            fVar13 = -(float)local_d8._0_4_;
            lVar5 = 0;
            local_d8._0_8_ = local_d8._0_8_ ^ 0x8000000080000000;
            local_d8._8_4_ = local_d8._8_4_ ^ 0x80000000;
            local_d8._12_4_ = local_d8._12_4_ ^ 0x80000000;
            do {
              fVar8 = local_58[lVar5 * 2] + local_1b4;
              fVar9 = local_58[lVar5 * 2 + 1] + (float)local_1d8._32_4_;
              fVar10 = fVar9 / local_1e0;
              fVar11 = fVar8 / local_1dc;
              fVar8 = (local_1dc * (fVar10 + -1.0) + fVar8) * local_170 +
                      (local_174 * fVar10 + fVar8 * local_168) * fVar13;
              fVar13 = (local_1e0 * (fVar11 + -1.0) + fVar9) * local_170 +
                       (local_180 * fVar11 + fVar9 * local_16c) * fVar13;
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)local_1d8,
                         ((((fVar10 + -1.0) * local_17c + fVar10 * local_178) *
                          (float)local_78._0_4_) / (fVar8 * fVar8)) * local_1e4,
                         ((((fVar11 + -1.0) * local_184 + fVar11 * local_164) *
                          (float)local_68._0_4_) / (fVar13 * fVar13)) * local_1e4,lodPrec);
              local_1ec = (float)(~-(uint)(local_1ec <= (float)local_1d8._0_4_) & local_1d8._0_4_ |
                                 (uint)local_1ec & -(uint)(local_1ec <= (float)local_1d8._0_4_));
              local_1e8 = (float)(~-(uint)((float)local_1d8._4_4_ <= local_1e8) & local_1d8._4_4_ |
                                 (uint)local_1e8 & -(uint)((float)local_1d8._4_4_ <= local_1e8));
              lVar5 = lVar5 + 1;
              fVar13 = (float)local_d8._0_4_;
            } while (lVar5 != 4);
            local_1d8._0_4_ = R;
            local_1d8._4_4_ = SNORM_INT8;
            lVar5 = 0;
            do {
              *(float *)(local_1d8 + lVar5 * 4) = (float)(&local_1ec)[lVar5] + afStack_b0[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 == 1);
            local_160.m_data[0] = sampleParams->minLod;
            local_160.m_data[1] = sampleParams->maxLod;
            tcu::clampLodBounds(local_38,(Vec2 *)local_1d8,&local_160,lodPrec);
            bVar4 = tcu::isLookupResultValid
                              (&local_88,local_c8,lookupPrec,(Vec2 *)local_1a8,(Vec2 *)local_38,
                               &local_148);
            if (!bVar4) {
              local_160.m_data[0] = -1.7014636e+38;
              tcu::RGBA::toVec((RGBA *)local_1d8);
              tcu::PixelBufferAccess::setPixel(local_e0,(Vec4 *)local_1d8,y,local_1f0,0);
              local_1b0 = (ulong)((int)local_1b0 + 1);
            }
          }
          else {
            uVar3 = 0;
            do {
              uVar6 = uVar3;
              if (uVar6 == 3) break;
              uVar3 = uVar6 + 1;
            } while (*(char *)((long)&local_1ec + uVar6 + 1) != '\0');
            if (uVar6 < 3) goto LAB_0085230f;
          }
          y = y + 1;
          result = local_c0;
        } while (y < (local_c0->m_size).m_data[0]);
      }
      local_1f0 = local_1f0 + 1;
    } while (local_1f0 < (result->m_size).m_data[1]);
  }
  if (local_a8.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)local_1b0;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture1DArrayView&		baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture1DArrayView				src					= getEffectiveTextureView(baseView, srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const float									srcSize				= float(src.getWidth()); // For lod computation, thus #layers is ignored.

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec2	coord	(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
										 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy));
				const float	coordDx		= triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy) * srcSize;
				const float	coordDy		= triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx) * srcSize;

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx, coordDy, lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const float	coordDxo		= triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo) * srcSize;
					const float	coordDyo		= triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo) * srcSize;
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo, coordDyo, lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}